

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O1

bool __thiscall QMdiSubWindow::eventFilter(QMdiSubWindow *this,QObject *object,QEvent *event)

{
  ushort uVar1;
  short sVar2;
  int iVar3;
  QMdiSubWindowPrivate *this_00;
  Data *pDVar4;
  QWidgetData *pQVar5;
  char16_t *pcVar6;
  undefined1 *puVar7;
  Representation RVar8;
  Representation RVar9;
  Representation RVar10;
  undefined1 uVar11;
  byte bVar12;
  char cVar13;
  undefined4 uVar14;
  uint uVar15;
  LayoutDirection LVar16;
  WindowStates WVar17;
  SubControl SVar18;
  int iVar19;
  QObject *pQVar20;
  long lVar21;
  QPoint QVar22;
  QStyle *pQVar23;
  QWidget *pQVar24;
  ulong uVar25;
  QAction *pQVar26;
  QWidget *pQVar27;
  int iVar28;
  ulong uVar29;
  QMouseEvent *mouseEvent;
  long in_FS_OFFSET;
  bool bVar30;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  double extraout_XMM1_Qa;
  double extraout_XMM1_Qa_00;
  double extraout_XMM1_Qa_01;
  undefined1 auVar36 [16];
  QStringView QVar37;
  QLatin1String QVar38;
  QStringView QVar39;
  QStringView QVar40;
  QStringView QVar41;
  QStyleOptionTitleBar titleBarOptions;
  QString local_d8;
  QString local_c0;
  undefined1 local_a8 [16];
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  QPalettePrivate *pQStack_80;
  undefined1 *local_78;
  QObject *pQStack_70;
  undefined1 *local_68;
  QArrayData *pQStack_60;
  char16_t *local_58;
  undefined1 *puStack_50;
  QIcon local_48;
  undefined1 *puStack_40;
  long local_38;
  QPoint *pt;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (object == (QObject *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      object = (QObject *)0x0;
      goto LAB_00457e5d;
    }
    goto LAB_004585c1;
  }
  this_00 = *(QMdiSubWindowPrivate **)&(this->super_QWidget).field_0x8;
  pDVar4 = (this_00->systemMenu).wp.d;
  if (((pDVar4 != (Data *)0x0) && (*(int *)(pDVar4 + 4) != 0)) &&
     ((this_00->systemMenu).wp.value != (QObject *)0x0)) {
    if ((pDVar4 == (Data *)0x0) || (*(int *)(pDVar4 + 4) == 0)) {
      pQVar20 = (QObject *)0x0;
    }
    else {
      pQVar20 = (this_00->systemMenu).wp.value;
    }
    if (pQVar20 != object) goto LAB_00457cb1;
    sVar2 = *(short *)(event + 8);
    if (sVar2 == 0x12) {
      this_00->activeSubControl = SC_None;
      pQVar5 = (this->super_QWidget).data;
      iVar28 = (pQVar5->crect).x2.m_i;
      iVar3 = (pQVar5->crect).x1.m_i;
      iVar19 = QMdiSubWindowPrivate::titleBarHeight(this_00);
      QRegion::QRegion((QRegion *)local_a8,0,0,(iVar28 - iVar3) + 1,iVar19,Rectangle);
      QWidget::update(&this->super_QWidget,(QRegion *)local_a8);
      QRegion::~QRegion((QRegion *)local_a8);
    }
    else if (sVar2 == 5) {
      uVar14 = QEventPoint::globalPosition();
      auVar36._0_8_ =
           (double)((ulong)extraout_XMM1_Qa_00 & 0x8000000000000000 | 0x3fe0000000000000) +
           extraout_XMM1_Qa_00;
      auVar36._8_8_ =
           (double)((ulong)extraout_XMM0_Qa_00 & 0x8000000000000000 | 0x3fe0000000000000) +
           extraout_XMM0_Qa_00;
      auVar36 = minpd(_DAT_0066f5d0,auVar36);
      auVar33._8_8_ = -(ulong)(-2147483648.0 < auVar36._8_8_);
      auVar33._0_8_ = -(ulong)(-2147483648.0 < auVar36._0_8_);
      uVar15 = movmskpd(uVar14,auVar33);
      uVar29 = 0x8000000000000000;
      if ((uVar15 & 1) != 0) {
        uVar29 = (ulong)(uint)(int)auVar36._0_8_ << 0x20;
      }
      uVar25 = 0x80000000;
      if ((uVar15 & 2) != 0) {
        uVar25 = (ulong)(uint)(int)auVar36._8_8_;
      }
      local_d8.d.d = (Data *)(uVar25 | uVar29);
      local_c0.d.d = (Data *)QWidget::mapFromGlobal(&this->super_QWidget,(QPoint *)&local_d8);
      pQVar24 = *(QWidget **)&(this_00->super_QWidgetPrivate).field_0x8;
      local_48.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_60 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_70 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_80 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      local_98 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
      local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QMdiSubWindowPrivate::titleBarOptions((QStyleOptionTitleBar *)local_a8,this_00);
      pQVar23 = QWidget::style(pQVar24);
      SVar18 = (**(code **)(*(long *)pQVar23 + 0xd0))(pQVar23,5,local_a8,&local_c0,pQVar24);
      QIcon::~QIcon(&local_48);
      if (pQStack_60 != (QArrayData *)0x0) {
        LOCK();
        (pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQStack_60,2,0x10);
        }
      }
      QStyleOption::~QStyleOption((QStyleOption *)local_a8);
      this_00->hoveredSubControl = SVar18;
    }
    else if (sVar2 == 4) {
      if ((pDVar4 == (Data *)0x0) || (*(int *)(pDVar4 + 4) == 0)) {
        pQVar20 = (QObject *)0x0;
      }
      else {
        pQVar20 = (this_00->systemMenu).wp.value;
      }
      uVar14 = QEventPoint::position();
      auVar34._0_8_ =
           (double)((ulong)extraout_XMM1_Qa_01 & 0x8000000000000000 | 0x3fe0000000000000) +
           extraout_XMM1_Qa_01;
      auVar34._8_8_ =
           (double)((ulong)extraout_XMM0_Qa_01 & 0x8000000000000000 | 0x3fe0000000000000) +
           extraout_XMM0_Qa_01;
      auVar36 = minpd(_DAT_0066f5d0,auVar34);
      auVar35._8_8_ = -(ulong)(-2147483648.0 < auVar36._8_8_);
      auVar35._0_8_ = -(ulong)(-2147483648.0 < auVar36._0_8_);
      uVar15 = movmskpd(uVar14,auVar35);
      uVar29 = 0x8000000000000000;
      if ((uVar15 & 1) != 0) {
        uVar29 = (ulong)(uint)(int)auVar36._0_8_ << 0x20;
      }
      uVar25 = 0x80000000;
      if ((uVar15 & 2) != 0) {
        uVar25 = (ulong)(uint)(int)auVar36._8_8_;
      }
      local_a8._0_8_ = uVar25 | uVar29;
      pt = (QPoint *)local_a8;
      pQVar26 = QMenu::actionAt((QMenu *)pQVar20,pt);
      iVar28 = (int)pt;
      if ((pQVar26 == (QAction *)0x0) || (cVar13 = QAction::isEnabled(), cVar13 != '\0')) {
        QWidget::close(&this->super_QWidget,iVar28);
      }
    }
    goto LAB_0045858e;
  }
LAB_00457cb1:
  pDVar4 = (this_00->baseWidget).wp.d;
  if ((pDVar4 == (Data *)0x0) || (*(int *)(pDVar4 + 4) == 0)) {
    pQVar20 = (QObject *)0x0;
  }
  else {
    pQVar20 = (this_00->baseWidget).wp.value;
  }
  if (((pQVar20 == object) || (*(long *)&(this_00->super_QWidgetPrivate).field_0x10 == 0)) ||
     (lVar21 = QMetaObject::cast((QObject *)&QSizeGrip::staticMetaObject), lVar21 == 0)) {
    pDVar4 = (this_00->baseWidget).wp.d;
    if ((pDVar4 == (Data *)0x0) || (*(int *)(pDVar4 + 4) == 0)) {
      pQVar20 = (QObject *)0x0;
    }
    else {
      pQVar20 = (this_00->baseWidget).wp.value;
    }
    if ((pQVar20 != object) && (*(short *)(event + 8) != 0x21)) goto LAB_00457e40;
    uVar1 = *(ushort *)(event + 8);
    if (uVar1 < 0x21) {
      if (uVar1 == 10) {
        this_00->currentOperation = None;
        QMdiSubWindowPrivate::updateCursor(this_00);
      }
      else if (uVar1 == 0x11) {
        QMdiSubWindowPrivate::setActive(this_00,true,true);
      }
      else if ((uVar1 == 0x1a) && (this_00->isWidgetHiddenByUs == false)) {
        QWidget::show(&this->super_QWidget);
      }
    }
    else if (uVar1 < 0x66) {
      if (uVar1 == 0x21) {
        if (this_00->ignoreWindowTitleChange == false) {
          if ((pDVar4 == (Data *)0x0) || (*(int *)(pDVar4 + 4) == 0)) {
            pQVar20 = (QObject *)0x0;
          }
          else {
            pQVar20 = (this_00->baseWidget).wp.value;
          }
          if (pQVar20 == object) {
            QMdiSubWindowPrivate::updateWindowTitle(this_00,true);
            QWidget::windowTitle((QString *)local_a8,(QWidget *)(this_00->baseWidget).wp.value);
            QVar22 = (QPoint)(this_00->lastChildWindowTitle).d.d;
            pcVar6 = (this_00->lastChildWindowTitle).d.ptr;
            (this_00->lastChildWindowTitle).d.d = (Data *)local_a8._0_8_;
            (this_00->lastChildWindowTitle).d.ptr = (char16_t *)local_a8._8_8_;
            puVar7 = (undefined1 *)(this_00->lastChildWindowTitle).d.size;
            (this_00->lastChildWindowTitle).d.size = (qsizetype)local_98;
            local_a8._0_8_ = QVar22;
            local_a8._8_8_ = pcVar6;
            local_98 = puVar7;
            if (QVar22 != (QPoint)0x0) {
              LOCK();
              *(int *)QVar22 = *(int *)QVar22 + -1;
              UNLOCK();
              if (*(int *)QVar22 == 0) {
                QArrayData::deallocate((QArrayData *)QVar22,2,0x10);
              }
            }
          }
          else {
            pQVar24 = maximizedButtonsWidget(this);
            if (pQVar24 != (QWidget *)0x0) {
              pDVar4 = (this_00->controlContainer).wp.d;
              if ((pDVar4 == (Data *)0x0) || (*(int *)(pDVar4 + 4) == 0)) {
                pQVar20 = (QObject *)0x0;
              }
              else {
                pQVar20 = (this_00->controlContainer).wp.value;
              }
              if (((*(long *)(pQVar20 + 0x30) != 0) &&
                  (*(int *)(*(long *)(pQVar20 + 0x30) + 4) != 0)) &&
                 (*(long *)(pQVar20 + 0x38) != 0)) {
                pQVar24 = QMenuBar::cornerWidget
                                    (*(QMenuBar **)((this_00->controlContainer).wp.value + 0x38),
                                     TopRightCorner);
                pQVar27 = maximizedButtonsWidget(this);
                if (pQVar24 == pQVar27) {
                  QString::clear(&this_00->originalTitle);
                  pDVar4 = (this_00->baseWidget).wp.d;
                  if ((pDVar4 == (Data *)0x0) || (*(int *)(pDVar4 + 4) == 0)) {
                    bVar30 = false;
                  }
                  else {
                    bVar30 = (this_00->baseWidget).wp.value != (QObject *)0x0;
                  }
                  if (bVar30) {
                    QWidget::windowTitle
                              ((QString *)local_a8,(QWidget *)(this_00->baseWidget).wp.value);
                    QWidget::windowTitle(&local_c0,&this->super_QWidget);
                    if (local_98 != (undefined1 *)local_c0.d.size) goto LAB_0045852b;
                    QVar39.m_data = (storage_type_conflict *)local_a8._8_8_;
                    QVar39.m_size = (qsizetype)local_98;
                    QVar41.m_data = local_c0.d.ptr;
                    QVar41.m_size = local_c0.d.size;
                    cVar13 = QtPrivate::equalStrings(QVar39,QVar41);
                  }
                  else {
LAB_0045852b:
                    cVar13 = '\0';
                  }
                  if (bVar30) {
                    if ((QPoint)local_c0.d.d != (QPoint)0x0) {
                      LOCK();
                      *(int *)local_c0.d.d = *(int *)local_c0.d.d + -1;
                      UNLOCK();
                      if (*(int *)local_c0.d.d == 0) {
                        QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    if ((QPoint)local_a8._0_8_ != (QPoint)0x0) {
                      LOCK();
                      *(int *)local_a8._0_8_ = *(int *)local_a8._0_8_ + -1;
                      UNLOCK();
                      if (*(int *)local_a8._0_8_ == 0) {
                        QArrayData::deallocate((QArrayData *)local_a8._0_8_,2,0x10);
                      }
                    }
                  }
                  QMdiSubWindowPrivate::updateWindowTitle(this_00,cVar13 != '\0');
                }
              }
            }
          }
        }
      }
      else if (uVar1 == 0x4c) {
        QMdiSubWindowPrivate::updateGeometryConstraints(this_00);
      }
    }
    else if (uVar1 == 0x66) {
      if ((pDVar4 == (Data *)0x0) || (*(int *)(pDVar4 + 4) == 0)) {
        pQVar20 = (QObject *)0x0;
      }
      else {
        pQVar20 = (this_00->baseWidget).wp.value;
      }
      if (pQVar20 == object) {
        bVar30 = QWidget::isWindowModified((QWidget *)(this_00->baseWidget).wp.value);
        if (bVar30) {
          bVar12 = 0;
        }
        else {
          QWidget::windowTitle((QString *)local_a8,(QWidget *)(this_00->baseWidget).wp.value);
          QWidget::windowTitle(&local_c0,&this->super_QWidget);
          bVar12 = 1;
          if (local_98 == (undefined1 *)local_c0.d.size) {
            QVar37.m_data = (storage_type_conflict *)local_a8._8_8_;
            QVar37.m_size = (qsizetype)local_98;
            QVar40.m_data = local_c0.d.ptr;
            QVar40.m_size = local_c0.d.size;
            bVar12 = QtPrivate::equalStrings(QVar37,QVar40);
            bVar12 = bVar12 ^ 1;
          }
        }
        if (!bVar30) {
          if ((QPoint)local_c0.d.d != (QPoint)0x0) {
            LOCK();
            *(int *)local_c0.d.d = *(int *)local_c0.d.d + -1;
            UNLOCK();
            if (*(int *)local_c0.d.d == 0) {
              QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((QPoint)local_a8._0_8_ != (QPoint)0x0) {
            LOCK();
            *(int *)local_a8._0_8_ = *(int *)local_a8._0_8_ + -1;
            UNLOCK();
            if (*(int *)local_a8._0_8_ == 0) {
              QArrayData::deallocate((QArrayData *)local_a8._0_8_,2,0x10);
            }
          }
        }
        if (bVar12 == 0) {
          QWidget::windowTitle(&local_d8,&this->super_QWidget);
          QVar38.m_data = (char *)0x3;
          QVar38.m_size = (qsizetype)&local_d8;
          lVar21 = QString::indexOf(QVar38,0x6747ec,CaseInsensitive);
          if ((QPoint)local_d8.d.d != (QPoint)0x0) {
            LOCK();
            *(int *)local_d8.d.d = *(int *)local_d8.d.d + -1;
            UNLOCK();
            if (*(int *)local_d8.d.d == 0) {
              QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (lVar21 != -1) {
            QWidget::setWindowModified(&this->super_QWidget,bVar30);
          }
        }
      }
    }
    else if ((uVar1 == 0x69) && (cVar13 = QWindowStateChangeEvent::isOverride(), cVar13 == '\0')) {
      uVar15 = *(uint *)(event + 0x10);
      WVar17 = QWidget::windowState((QWidget *)(this_00->baseWidget).wp.value);
      if (((uVar15 & 1) == 0) &&
         (((uint)WVar17.super_QFlagsStorageHelper<Qt::WindowState,_4>.
                 super_QFlagsStorage<Qt::WindowState>.i & 1) != 0)) {
        QWidget::showMinimized(&this->super_QWidget);
      }
      else if (((uVar15 & 2) == 0) &&
              (((uint)WVar17.super_QFlagsStorageHelper<Qt::WindowState,_4>.
                      super_QFlagsStorage<Qt::WindowState>.i & 2) != 0)) {
        QWidget::showMaximized(&this->super_QWidget);
      }
      else if (((uint)WVar17.super_QFlagsStorageHelper<Qt::WindowState,_4>.
                      super_QFlagsStorage<Qt::WindowState>.i & 7) == 0) {
        QWidget::showNormal(&this->super_QWidget);
      }
    }
LAB_0045858e:
    uVar11 = QObject::eventFilter((QObject *)this,(QEvent *)object);
  }
  else {
    if ((*(short *)(event + 8) != 2) ||
       (lVar21 = *(long *)&(this->super_QWidget).field_0x8, (*(byte *)(lVar21 + 0x388) & 4) == 0)) {
LAB_00457e40:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
LAB_00457e5d:
        uVar11 = QObject::eventFilter((QObject *)this,(QEvent *)object);
        return (bool)uVar11;
      }
      goto LAB_004585c1;
    }
    pQVar24 = *(QWidget **)(lVar21 + 0x10);
    uVar14 = QEventPoint::globalPosition();
    auVar31._0_8_ =
         (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
         extraout_XMM1_Qa;
    auVar31._8_8_ =
         (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
         extraout_XMM0_Qa;
    auVar36 = minpd(_DAT_0066f5d0,auVar31);
    auVar32._8_8_ = -(ulong)(-2147483648.0 < auVar36._8_8_);
    auVar32._0_8_ = -(ulong)(-2147483648.0 < auVar36._0_8_);
    uVar15 = movmskpd(uVar14,auVar32);
    uVar29 = 0x8000000000000000;
    if ((uVar15 & 1) != 0) {
      uVar29 = (ulong)(uint)(int)auVar36._0_8_ << 0x20;
    }
    uVar25 = 0x80000000;
    if ((uVar15 & 2) != 0) {
      uVar25 = (ulong)(uint)(int)auVar36._8_8_;
    }
    local_a8._0_8_ = uVar25 | uVar29;
    QVar22 = QWidget::mapFromGlobal(pQVar24,(QPoint *)local_a8);
    this_00->mousePressPosition = QVar22;
    pQVar5 = (this->super_QWidget).data;
    RVar8.m_i = (pQVar5->crect).y1.m_i;
    RVar9.m_i = (pQVar5->crect).x2.m_i;
    RVar10.m_i = (pQVar5->crect).y2.m_i;
    (this_00->oldGeometry).x1 = (Representation)(pQVar5->crect).x1.m_i;
    (this_00->oldGeometry).y1 = (Representation)RVar8.m_i;
    (this_00->oldGeometry).x2 = (Representation)RVar9.m_i;
    (this_00->oldGeometry).y2 = (Representation)RVar10.m_i;
    LVar16 = QWidget::layoutDirection(&this->super_QWidget);
    this_00->currentOperation = (LVar16 == LeftToRight) + BottomLeftResize;
    QMdiSubWindowPrivate::enterRubberBandMode(this_00);
    uVar11 = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)uVar11;
  }
LAB_004585c1:
  __stack_chk_fail();
}

Assistant:

bool QMdiSubWindow::eventFilter(QObject *object, QEvent *event)
{
    Q_D(QMdiSubWindow);
    if (!object)
        return QWidget::eventFilter(object, event);

#if QT_CONFIG(menu)
    // System menu events.
    if (d->systemMenu && d->systemMenu == object) {
        if (event->type() == QEvent::MouseButtonDblClick) {
            const QMouseEvent *mouseEvent = static_cast<const QMouseEvent *>(event);
            const QAction *action = d->systemMenu->actionAt(mouseEvent->position().toPoint());
            if (!action || action->isEnabled())
                close();
        } else if (event->type() == QEvent::MouseMove) {
            QMouseEvent *mouseEvent = static_cast<QMouseEvent *>(event);
            d->hoveredSubControl = d->getSubControl(mapFromGlobal(mouseEvent->globalPosition().toPoint()));
        } else if (event->type() == QEvent::Hide) {
            d->activeSubControl = QStyle::SC_None;
            update(QRegion(0, 0, width(), d->titleBarHeight()));
        }
        return QWidget::eventFilter(object, event);
    }
#endif

#if QT_CONFIG(sizegrip)
    if (object != d->baseWidget && parent() && qobject_cast<QSizeGrip *>(object)) {
        if (event->type() != QEvent::MouseButtonPress || !testOption(QMdiSubWindow::RubberBandResize))
            return QWidget::eventFilter(object, event);
        const QMouseEvent *mouseEvent = static_cast<QMouseEvent *>(event);
        d->mousePressPosition = parentWidget()->mapFromGlobal(mouseEvent->globalPosition().toPoint());
        d->oldGeometry = geometry();
        d->currentOperation = isLeftToRight() ? QMdiSubWindowPrivate::BottomRightResize
                                              : QMdiSubWindowPrivate::BottomLeftResize;
#if QT_CONFIG(rubberband)
        d->enterRubberBandMode();
#endif
        return true;
    }
#endif

    if (object != d->baseWidget && event->type() != QEvent::WindowTitleChange)
        return QWidget::eventFilter(object, event);

    switch (event->type()) {
    case QEvent::Show:
        d->setActive(true);
        break;
    case QEvent::ShowToParent:
        if (!d->isWidgetHiddenByUs)
            show();
        break;
    case QEvent::WindowStateChange: {
        QWindowStateChangeEvent *changeEvent = static_cast<QWindowStateChangeEvent*>(event);
        if (changeEvent->isOverride())
            break;
        Qt::WindowStates oldState = changeEvent->oldState();
        Qt::WindowStates newState = d->baseWidget->windowState();
        if (!(oldState & Qt::WindowMinimized) && (newState & Qt::WindowMinimized))
            showMinimized();
        else if (!(oldState & Qt::WindowMaximized) && (newState & Qt::WindowMaximized))
            showMaximized();
        else if (!(newState & (Qt::WindowMaximized | Qt::WindowMinimized | Qt::WindowFullScreen)))
            showNormal();
        break;
    }
    case QEvent::Enter:
        d->currentOperation = QMdiSubWindowPrivate::None;
        d->updateCursor();
        break;
    case QEvent::LayoutRequest:
        d->updateGeometryConstraints();
        break;
    case QEvent::WindowTitleChange:
        if (d->ignoreWindowTitleChange)
            break;
        if (object == d->baseWidget) {
            d->updateWindowTitle(true);
            d->lastChildWindowTitle = d->baseWidget->windowTitle();
#if QT_CONFIG(menubar)
        } else if (maximizedButtonsWidget() && d->controlContainer->menuBar() && d->controlContainer->menuBar()
                   ->cornerWidget(Qt::TopRightCorner) == maximizedButtonsWidget()) {
            d->originalTitle.clear();
            if (d->baseWidget && d->baseWidget->windowTitle() == windowTitle())
                d->updateWindowTitle(true);
            else
                d->updateWindowTitle(false);
#endif
        }
        break;
    case QEvent::ModifiedChange: {
        if (object != d->baseWidget)
            break;
        bool windowModified = d->baseWidget->isWindowModified();
        if (!windowModified && d->baseWidget->windowTitle() != windowTitle())
            break;
        if (windowTitle().contains("[*]"_L1))
            setWindowModified(windowModified);
        break;
    }
    default:
        break;
    }
    return QWidget::eventFilter(object, event);
}